

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Block *b)

{
  pointer ppVar1;
  pool_ref<soul::AST::Statement> *s;
  pointer ppVar2;
  
  ppVar1 = (b->statements).
           super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (b->statements).
                super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    (*this->_vptr_ASTVisitor[4])(this,ppVar2->object);
  }
  return;
}

Assistant:

virtual void visit (AST::Block& b)
    {
        for (auto& s : b.statements)
            visitObject (s);
    }